

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::UInt64Size(RepeatedField<unsigned_long> *value)

{
  long lVar1;
  unsigned_long *puVar2;
  int index;
  size_t sVar3;
  int iVar4;
  
  sVar3 = 0;
  iVar4 = value->current_size_;
  if (value->current_size_ < 1) {
    iVar4 = 0;
  }
  for (index = 0; iVar4 != index; index = index + 1) {
    puVar2 = RepeatedField<unsigned_long>::Get(value,index);
    lVar1 = 0x3f;
    if ((*puVar2 | 1) != 0) {
      for (; (*puVar2 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar1 * 9 + 0x49U >> 6);
  }
  return sVar3;
}

Assistant:

size_t WireFormatLite::UInt64Size(const RepeatedField<uint64>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += UInt64Size(value.Get(i));
  }
  return out;
}